

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::is_empty(path *p,error_code *ec)

{
  bool bVar1;
  byte bVar2;
  uintmax_t uVar3;
  error_code *in_RSI;
  uintmax_t sz;
  directory_iterator iter;
  path *in_stack_00000038;
  file_status fs;
  directory_iterator *rhs;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  element_type *in_stack_ffffffffffffffb0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffb8;
  directory_iterator *in_stack_ffffffffffffffc0;
  directory_iterator *in_stack_ffffffffffffffd0;
  file_status local_20;
  error_code *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  status((path *)in_stack_ffffffffffffffb8._M_pi,(error_code *)in_stack_ffffffffffffffb0);
  bVar1 = std::error_code::operator_cast_to_bool(local_18);
  if (bVar1) {
    local_1 = 0;
  }
  else {
    file_status::file_status((file_status *)&stack0xffffffffffffffd4,&local_20);
    bVar2 = is_directory((file_status *)0x28f40d);
    file_status::~file_status((file_status *)&stack0xffffffffffffffd4);
    if ((bVar2 & 1) == 0) {
      uVar3 = file_size(in_stack_00000038,
                        (error_code *)
                        iter._impl.
                        super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi);
      bVar1 = std::error_code::operator_cast_to_bool(local_18);
      if (bVar1) {
        local_1 = 0;
      }
      else {
        local_1 = uVar3 == 0;
      }
    }
    else {
      directory_iterator::directory_iterator
                (in_stack_ffffffffffffffc0,(path *)in_stack_ffffffffffffffb8._M_pi,
                 (error_code *)in_stack_ffffffffffffffb0);
      bVar1 = std::error_code::operator_cast_to_bool(local_18);
      if (bVar1) {
        local_1 = 0;
      }
      else {
        rhs = (directory_iterator *)&stack0xffffffffffffffb0;
        directory_iterator::directory_iterator(in_stack_ffffffffffffffd0);
        local_1 = directory_iterator::operator==
                            ((directory_iterator *)
                             CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffa6,
                                                     in_stack_ffffffffffffffa0)),rhs);
        directory_iterator::~directory_iterator((directory_iterator *)0x28f48e);
      }
      directory_iterator::~directory_iterator((directory_iterator *)0x28f4a0);
    }
  }
  file_status::~file_status(&local_20);
  return (bool)(local_1 & 1);
}

Assistant:

GHC_INLINE bool is_empty(const path& p, std::error_code& ec) noexcept
{
    auto fs = status(p, ec);
    if (ec) {
        return false;
    }
    if (is_directory(fs)) {
        directory_iterator iter(p, ec);
        if (ec) {
            return false;
        }
        return iter == directory_iterator();
    }
    else {
        auto sz = file_size(p, ec);
        if (ec) {
            return false;
        }
        return sz == 0;
    }
}